

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrinter<(anonymous_namespace)::KtxTexture<ktxTexture>_>::Print
               (KtxTexture<ktxTexture> *value,ostream *os)

{
  KtxTexture<ktxTexture> *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  PrintTo<(anonymous_namespace)::KtxTexture<ktxTexture>>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }